

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_key_derivation_setup(psa_key_derivation_operation_t *operation,psa_algorithm_t alg)

{
  int local_20;
  psa_algorithm_t kdf_alg;
  psa_status_t status;
  psa_algorithm_t alg_local;
  psa_key_derivation_operation_t *operation_local;
  
  if (operation->alg == 0) {
    if (((alg & 0x7f000000) == 0x30000000) && ((alg & 0x803ffff | 0x20000000) == 0x20000000)) {
      operation_local._4_4_ = -0x87;
    }
    else {
      if ((alg & 0x7f000000) == 0x30000000) {
        local_20 = psa_key_derivation_setup_kdf(operation,alg & 0x803ffff | 0x20000000);
      }
      else {
        if ((alg & 0x7f000000) != 0x20000000) {
          return -0x87;
        }
        local_20 = psa_key_derivation_setup_kdf(operation,alg);
      }
      if (local_20 == 0) {
        operation->alg = alg;
      }
      operation_local._4_4_ = local_20;
    }
  }
  else {
    operation_local._4_4_ = -0x89;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_key_derivation_setup( psa_key_derivation_operation_t *operation,
                                       psa_algorithm_t alg )
{
    psa_status_t status;

    if( operation->alg != 0 )
        return( PSA_ERROR_BAD_STATE );

    if( PSA_ALG_IS_RAW_KEY_AGREEMENT( alg ) )
        return( PSA_ERROR_INVALID_ARGUMENT );
    else if( PSA_ALG_IS_KEY_AGREEMENT( alg ) )
    {
        psa_algorithm_t kdf_alg = PSA_ALG_KEY_AGREEMENT_GET_KDF( alg );
        status = psa_key_derivation_setup_kdf( operation, kdf_alg );
    }
    else if( PSA_ALG_IS_KEY_DERIVATION( alg ) )
    {
        status = psa_key_derivation_setup_kdf( operation, alg );
    }
    else
        return( PSA_ERROR_INVALID_ARGUMENT );

    if( status == PSA_SUCCESS )
        operation->alg = alg;
    return( status );
}